

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

FT_Fixed mm_axis_unmap(PS_DesignMap axismap,FT_Fixed ncv)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  FT_Long FVar4;
  ulong uVar5;
  ulong uVar6;
  
  plVar1 = axismap->blend_points;
  if (*plVar1 < ncv) {
    uVar5 = (ulong)axismap->num_points;
    if (1 < uVar5) {
      uVar6 = 1;
      do {
        if (ncv <= plVar1[uVar6]) {
          lVar3 = axismap->design_points[uVar6 - 1];
          lVar2 = axismap->design_points[uVar6];
          FVar4 = FT_DivFix(ncv - plVar1[uVar6 - 1],plVar1[uVar6] - plVar1[uVar6 - 1]);
          return FVar4 * (lVar2 - lVar3) + lVar3 * 0x10000;
        }
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    lVar3 = axismap->design_points[uVar5 - 1];
  }
  else {
    lVar3 = *axismap->design_points;
  }
  return lVar3 << 0x10;
}

Assistant:

static FT_Fixed
  mm_axis_unmap( PS_DesignMap  axismap,
                 FT_Fixed      ncv )
  {
    int  j;


    if ( ncv <= axismap->blend_points[0] )
      return INT_TO_FIXED( axismap->design_points[0] );

    for ( j = 1; j < axismap->num_points; j++ )
    {
      if ( ncv <= axismap->blend_points[j] )
        return INT_TO_FIXED( axismap->design_points[j - 1] ) +
               ( axismap->design_points[j] - axismap->design_points[j - 1] ) *
               FT_DivFix( ncv - axismap->blend_points[j - 1],
                          axismap->blend_points[j] -
                            axismap->blend_points[j - 1] );
    }

    return INT_TO_FIXED( axismap->design_points[axismap->num_points - 1] );
  }